

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  SourceLineInfo *_lineInfo;
  TestCase *_name;
  IStreamingReporter *pIVar1;
  size_t sVar2;
  size_t sVar3;
  TestCaseTracker *this_00;
  pointer pUVar4;
  pointer pUVar5;
  double *pdVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool _missingAssertions;
  uint uVar9;
  streambuf *psVar10;
  Counts *pCVar11;
  undefined1 auVar12 [16];
  SectionInfo testCaseSection;
  Counts assertions;
  SectionStats testCaseSectionStats;
  string local_470;
  SectionInfo local_450;
  StreamRedirect local_3e8;
  undefined1 local_258 [72];
  _Alloc_hider local_210;
  char local_200 [16];
  Flags local_1f0;
  
  _name = this->m_activeTestCase;
  _lineInfo = &(_name->super_TestCaseInfo).lineInfo;
  SectionInfo::SectionInfo
            (&local_450,(string *)_name,&(_name->super_TestCaseInfo).description,_lineInfo);
  pIVar1 = (this->m_reporter).m_p;
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[9])(pIVar1,&local_450);
  sVar2 = (this->m_totals).assertions.passed;
  sVar3 = (this->m_totals).assertions.failed;
  local_3e8.m_stream = (ostream *)&local_3e8.m_oss;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"TEST_CASE","");
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"");
  AssertionInfo::AssertionInfo
            ((AssertionInfo *)local_258,(string *)&local_3e8,_lineInfo,&local_470,Normal);
  std::__cxx11::string::operator=((string *)&this->m_lastAssertionInfo,(string *)local_258);
  std::__cxx11::string::_M_assign((string *)&(this->m_lastAssertionInfo).lineInfo);
  (this->m_lastAssertionInfo).lineInfo.line = local_258._64_8_;
  std::__cxx11::string::operator=
            ((string *)&(this->m_lastAssertionInfo).capturedExpression,(string *)&local_210);
  (this->m_lastAssertionInfo).resultDisposition = local_1f0;
  if (local_210._M_p != local_200) {
    operator_delete(local_210._M_p);
  }
  if ((undefined1 *)local_258._32_8_ != local_258 + 0x30) {
    operator_delete((void *)local_258._32_8_);
  }
  if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
    operator_delete((void *)local_258._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p);
  }
  if (local_3e8.m_stream != (ostream *)&local_3e8.m_oss) {
    operator_delete(local_3e8.m_stream);
  }
  this_00 = (this->m_testCaseTracker).nullableValue;
  this_00->m_currentSection = &this_00->m_testCase;
  this_00->m_completedASectionThisRun = false;
  if ((this_00->m_testCase).m_runState == NotStarted) {
    (this_00->m_testCase).m_runState = Executing;
  }
  gettimeofday((timeval *)local_258,(__timezone_ptr_t)0x0);
  uVar8 = local_258._8_8_;
  uVar7 = local_258._0_8_;
  uVar9 = (*(((this->m_reporter).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
  if ((uVar9 & 1) == 0) {
    (*(((this->m_activeTestCase->test).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])
              ();
  }
  else {
    StreamRedirect::StreamRedirect((StreamRedirect *)local_258,(ostream *)&std::cout,redirectedCout)
    ;
    StreamRedirect::StreamRedirect(&local_3e8,(ostream *)&std::cerr,redirectedCerr);
    (*(((this->m_activeTestCase->test).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])
              ();
    StreamRedirect::~StreamRedirect(&local_3e8);
    StreamRedirect::~StreamRedirect((StreamRedirect *)local_258);
  }
  gettimeofday((timeval *)local_258,(__timezone_ptr_t)0x0);
  psVar10 = (streambuf *)(local_258._8_8_ + ((local_258._0_8_ - uVar7) * 1000000 - uVar8));
  auVar12._8_4_ = (int)((ulong)psVar10 >> 0x20);
  auVar12._0_8_ = psVar10;
  auVar12._12_4_ = 0x45300000;
  SectionTracking::TrackedSection::leave(&this_00->m_testCase);
  pUVar4 = (this->m_unfinishedSections).
           super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pUVar5 = (this->m_unfinishedSections).
           super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pUVar4 != pUVar5) {
    pCVar11 = &pUVar4->prevAssertions;
    do {
      (*(this->super_IResultCapture)._vptr_IResultCapture[4])
                (*(double *)(pCVar11 + 1),this,(long)(pCVar11 + -7) + 8,pCVar11);
      pdVar6 = (double *)(pCVar11 + 1);
      pCVar11 = pCVar11 + 8;
    } while ((pointer)(pdVar6 + 1) != pUVar5);
  }
  std::
  vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ::_M_erase_at_end(&this->m_unfinishedSections,
                    (this->m_unfinishedSections).
                    super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::_M_erase_at_end
            (&this->m_messages,
             (this->m_messages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start);
  local_3e8.m_stream = (ostream *)((this->m_totals).assertions.passed - sVar2);
  local_3e8.m_prevBuf = (streambuf *)((this->m_totals).assertions.failed - sVar3);
  _missingAssertions = testForMissingAssertions(this,(Counts *)&local_3e8);
  SectionStats::SectionStats
            ((SectionStats *)local_258,&local_450,(Counts *)&local_3e8,
             ((auVar12._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)psVar10) - 4503599627370496.0)) / 1000000.0,
             _missingAssertions);
  pIVar1 = (this->m_reporter).m_p;
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar1,local_258);
  SectionStats::~SectionStats((SectionStats *)local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450.lineInfo.file._M_dataplus._M_p != &local_450.lineInfo.file.field_2) {
    operator_delete(local_450.lineInfo.file._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450.description._M_dataplus._M_p != &local_450.description.field_2) {
    operator_delete(local_450.description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450.name._M_dataplus._M_p != &local_450.name.field_2) {
    operator_delete(local_450.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void runCurrentTest( std::string& redirectedCout, std::string& redirectedCerr ) {
            TestCaseInfo const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
            SectionInfo testCaseSection( testCaseInfo.name, testCaseInfo.description, testCaseInfo.lineInfo );
            m_reporter->sectionStarting( testCaseSection );
            Counts prevAssertions = m_totals.assertions;
            double duration = 0;
            try {
                m_lastAssertionInfo = AssertionInfo( "TEST_CASE", testCaseInfo.lineInfo, "", ResultDisposition::Normal );
                TestCaseTracker::Guard guard( *m_testCaseTracker );

                Timer timer;
                timer.start();
                if( m_reporter->getPreferences().shouldRedirectStdOut ) {
                    StreamRedirect coutRedir( std::cout, redirectedCout );
                    StreamRedirect cerrRedir( std::cerr, redirectedCerr );
                    m_activeTestCase->invoke();
                }
                else {
                    m_activeTestCase->invoke();
                }
                duration = timer.getElapsedSeconds();
            }
            catch( TestFailureException& ) {
                // This just means the test was aborted due to failure
            }
            catch(...) {
                ExpressionResultBuilder exResult( ResultWas::ThrewException );
                exResult << translateActiveException();
                actOnCurrentResult( exResult.buildResult( m_lastAssertionInfo )  );
            }
            // If sections ended prematurely due to an exception we stored their
            // infos here so we can tear them down outside the unwind process.
            for( std::vector<UnfinishedSections>::const_iterator it = m_unfinishedSections.begin(),
                        itEnd = m_unfinishedSections.end();
                    it != itEnd;
                    ++it )
                sectionEnded( it->info, it->prevAssertions, it->durationInSeconds );
            m_unfinishedSections.clear();
            m_messages.clear();

            Counts assertions = m_totals.assertions - prevAssertions;
            bool missingAssertions = testForMissingAssertions( assertions );

            SectionStats testCaseSectionStats( testCaseSection, assertions, duration, missingAssertions );
            m_reporter->sectionEnded( testCaseSectionStats );
        }